

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

void __thiscall amrex::BoxArray::removeOverlap(BoxArray *this,bool simplify)

{
  pointer *ppBVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  iterator __position;
  ulong uVar5;
  iterator __position_00;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  mapped_type *this_00;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  Box *b;
  Box *pBVar16;
  pointer pBVar17;
  IndexType _btype;
  pointer pBVar18;
  BoxArray *pBVar19;
  ulong uVar20;
  BoxArray *pBVar21;
  ulong uVar22;
  Box *b_1;
  ulong uVar23;
  byte bVar24;
  IntVect IVar25;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxList bl;
  BoxList bl_diff;
  BoxArray nba;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_f8;
  BoxList local_d8;
  BoxList local_b8;
  BoxArray local_98;
  
  bVar24 = 0;
  uVar10 = 0;
  switch((this->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar10 = (this->m_bat).m_op.m_indexType.m_typ.itype;
    break;
  default:
    uVar10 = (this->m_bat).m_op.m_bndryReg.m_typ.itype;
  }
  if (uVar10 != 0) {
    Abort_host("BoxArray::removeOverlap() supports cell-centered only");
  }
  IVar25 = BATransformer::coarsen_ratio(&this->m_bat);
  if (IVar25.vect[2] != 1 || IVar25.vect._0_8_ != 0x100000001) {
    Abort_host("BoxArray::removeOverlap() must have m_crse_ratio == 1");
  }
  uniqify(this);
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BoxList::BoxList(&local_b8);
  peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar18 = (peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar17 = *(pointer *)
             ((long)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data + 8);
  if (pBVar17 != pBVar18 && -1 < (long)pBVar17 - (long)pBVar18) {
    uVar22 = 0;
    do {
      if ((((pBVar18[uVar22].smallend.vect[0] <= pBVar18[uVar22].bigend.vect[0]) &&
           (pBVar16 = pBVar18 + uVar22, (pBVar16->smallend).vect[1] <= (pBVar16->bigend).vect[1]))
          && ((pBVar16->smallend).vect[2] <= (pBVar16->bigend).vect[2])) &&
         ((pBVar16->btype).itype < 8)) {
        local_98.m_bat._0_8_ = 0;
        local_98.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
        intersections(this,pBVar16,&local_f8,false,(IntVect *)&local_98);
        uVar10 = (uint)((ulong)((long)local_f8.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_f8.
                                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
        if (0 < (int)uVar10) {
          uVar23 = 0;
          do {
            if (uVar22 != (uint)local_f8.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar23].first) {
              pBVar16 = (Box *)((long)local_f8.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar23].first * 0x1c
                               + *(long *)&(((this->m_ref).
                                             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->m_abox).
                                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                           ._M_impl.super__Vector_impl_data);
              boxDiff(&local_b8,pBVar16,
                      &local_f8.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar23].second);
              pBVar18 = local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              (pBVar16->smallend).vect[0] = 1;
              (pBVar16->smallend).vect[1] = 1;
              (pBVar16->smallend).vect[2] = 1;
              (pBVar16->bigend).vect[0] = 0;
              (pBVar16->bigend).vect[1] = 0;
              *(undefined8 *)((pBVar16->bigend).vect + 2) = 0;
              for (pBVar17 = local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start; pBVar17 != pBVar18;
                  pBVar17 = pBVar17 + 1) {
                peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                __position._M_current =
                     *(pointer *)
                      ((long)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data + 8);
                if (__position._M_current ==
                    *(pointer *)
                     ((long)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data + 0x10)) {
                  std::vector<amrex::Box,std::allocator<amrex::Box>>::
                  _M_realloc_insert<amrex::Box_const&>
                            ((vector<amrex::Box,std::allocator<amrex::Box>> *)peVar4,__position,
                             pBVar17);
                }
                else {
                  uVar6 = *(undefined8 *)(pBVar17->smallend).vect;
                  uVar7 = *(undefined8 *)((pBVar17->smallend).vect + 2);
                  uVar8 = *(undefined8 *)((pBVar17->bigend).vect + 2);
                  *(undefined8 *)((__position._M_current)->bigend).vect =
                       *(undefined8 *)(pBVar17->bigend).vect;
                  *(undefined8 *)(((__position._M_current)->bigend).vect + 2) = uVar8;
                  *(undefined8 *)((__position._M_current)->smallend).vect = uVar6;
                  *(undefined8 *)(((__position._M_current)->smallend).vect + 2) = uVar7;
                  ppBVar1 = (pointer *)
                            ((long)&(peVar4->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data + 8);
                  *ppBVar1 = *ppBVar1 + 1;
                }
                peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                uVar5 = *(ulong *)(pBVar17->smallend).vect;
                local_98.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(pBVar17->smallend).vect[2];
                iVar2 = (peVar4->crsn).vect[0];
                iVar15 = (int)uVar5;
                if (iVar2 == 1) {
                  local_98.m_bat._0_8_ = uVar5 & 0xffffffff;
                }
                else if (iVar2 == 4) {
                  if (iVar15 < 0) {
                    uVar13 = iVar15 + 1;
                    uVar11 = -uVar13;
                    if (0 < (int)uVar13) {
                      uVar11 = uVar13;
                    }
                    uVar11 = uVar11 >> 2;
                    goto LAB_00488333;
                  }
                  local_98.m_bat._0_8_ = uVar5 >> 2 & 0x3fffffff;
                }
                else if (iVar2 == 2) {
                  if (iVar15 < 0) {
                    uVar13 = iVar15 + 1;
                    uVar11 = -uVar13;
                    if (0 < (int)uVar13) {
                      uVar11 = uVar13;
                    }
                    uVar11 = uVar11 >> 1;
LAB_00488333:
                    local_98.m_bat._0_8_ = ZEXT48(~uVar11);
                  }
                  else {
                    local_98.m_bat._0_8_ = uVar5 >> 1 & 0x7fffffff;
                  }
                }
                else {
                  if (iVar15 < 0) {
                    iVar15 = iVar15 + 1;
                    iVar14 = -iVar15;
                    if (0 < iVar15) {
                      iVar14 = iVar15;
                    }
                    uVar11 = iVar14 / iVar2;
                    goto LAB_00488333;
                  }
                  local_98.m_bat._0_8_ =
                       (long)((ulong)(uint)(iVar15 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                       (long)iVar2 & 0xffffffff;
                }
                uVar20 = uVar5 >> 0x20;
                iVar2 = (peVar4->crsn).vect[1];
                if (iVar2 != 1) {
                  uVar11 = (uint)(uVar5 >> 0x20);
                  if (iVar2 == 4) {
                    if ((long)uVar5 < 0) {
                      uVar11 = uVar11 + 1;
                      uVar13 = -uVar11;
                      if (0 < (int)uVar11) {
                        uVar13 = uVar11;
                      }
                      uVar13 = uVar13 >> 2;
LAB_0048838b:
                      uVar13 = ~uVar13;
LAB_0048838d:
                      uVar20 = (ulong)uVar13;
                    }
                    else {
                      uVar20 = (ulong)(uVar11 >> 2);
                    }
                  }
                  else if (iVar2 == 2) {
                    if ((long)uVar5 < 0) {
                      uVar11 = uVar11 + 1;
                      uVar13 = -uVar11;
                      if (0 < (int)uVar11) {
                        uVar13 = uVar11;
                      }
                      uVar13 = uVar13 >> 1;
                      goto LAB_0048838b;
                    }
                    uVar20 = (ulong)(uVar11 >> 1);
                  }
                  else {
                    if (-1 < (long)uVar5) {
                      uVar13 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar20) /
                                     (long)iVar2);
                      goto LAB_0048838d;
                    }
                    iVar14 = uVar11 + 1;
                    iVar15 = -iVar14;
                    if (0 < iVar14) {
                      iVar15 = iVar14;
                    }
                    uVar20 = (ulong)(uint)~(iVar15 / iVar2);
                  }
                }
                iVar2 = (peVar4->crsn).vect[2];
                if (iVar2 != 1) {
                  if (iVar2 == 4) {
                    if ((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                      uVar13 = (int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype + 1;
                      uVar11 = -uVar13;
                      if (0 < (int)uVar13) {
                        uVar11 = uVar13;
                      }
                      uVar11 = uVar11 >> 2;
LAB_004883ee:
                      local_98.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)~uVar11;
                    }
                    else {
                      local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                           (IndexType)((uint)local_98.m_bat.m_op.m_bndryReg.m_typ.itype >> 2);
                    }
                  }
                  else if (iVar2 == 2) {
                    if ((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                      uVar13 = (int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype + 1;
                      uVar11 = -uVar13;
                      if (0 < (int)uVar13) {
                        uVar11 = uVar13;
                      }
                      uVar11 = uVar11 >> 1;
                      goto LAB_004883ee;
                    }
                    local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                         (IndexType)((uint)local_98.m_bat.m_op.m_bndryReg.m_typ.itype >> 1);
                  }
                  else if ((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                    iVar14 = (int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype + 1;
                    iVar15 = -iVar14;
                    if (0 < iVar14) {
                      iVar15 = iVar14;
                    }
                    local_98.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)~(iVar15 / iVar2);
                  }
                  else {
                    local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                         (IndexType)((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype / iVar2);
                  }
                }
                local_98.m_bat._0_8_ = local_98.m_bat._0_8_ | uVar20 << 0x20;
                this_00 = std::__detail::
                          _Map_base<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&peVar3->hash,(key_type *)&local_98);
                peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     (int)((ulong)((long)*(pointer *)
                                          ((long)&(peVar4->m_abox).
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&(peVar4->m_abox).
                                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data) >> 2) * -0x49249249 +
                     -1;
                __position_00._M_current =
                     (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (this_00,__position_00,(int *)&local_d8);
                }
                else {
                  *__position_00._M_current =
                       (int)local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position_00._M_current + 1;
                }
              }
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != (uVar10 & 0x7fffffff));
        }
      }
      uVar22 = uVar22 + 1;
      peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pBVar18 = (peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = ((long)*(pointer *)
                       ((long)&(peVar4->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) - (long)pBVar18 >> 2) *
               0x6db6db6db6db6db7;
    } while (lVar12 - uVar22 != 0 && (long)uVar22 <= lVar12);
  }
  _btype.itype = 0;
  switch((this->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    _btype.itype = (this->m_bat).m_op.m_indexType.m_typ.itype;
    break;
  default:
    _btype.itype = (this->m_bat).m_op.m_bndryReg.m_typ.itype;
  }
  BoxList::BoxList(&local_d8,_btype);
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar18 = (peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar17 = *(pointer *)
             ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data + 8);
  if (pBVar18 != pBVar17) {
    do {
      if ((((pBVar18->smallend).vect[0] <= (pBVar18->bigend).vect[0]) &&
          ((pBVar18->smallend).vect[1] <= (pBVar18->bigend).vect[1])) &&
         (((pBVar18->smallend).vect[2] <= (pBVar18->bigend).vect[2] && ((pBVar18->btype).itype < 8))
         )) {
        if (local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_d8,
                     (iterator)
                     local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish,pBVar18);
        }
        else {
          uVar6 = *(undefined8 *)(pBVar18->smallend).vect;
          uVar7 = *(undefined8 *)((pBVar18->smallend).vect + 2);
          uVar8 = *(undefined8 *)((pBVar18->bigend).vect + 2);
          *(undefined8 *)
           ((local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish)->bigend).vect =
               *(undefined8 *)(pBVar18->bigend).vect;
          *(undefined8 *)
           (((local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish)->bigend).vect + 2) = uVar8;
          *(undefined8 *)
           ((local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish)->smallend).vect = uVar6;
          *(undefined8 *)
           (((local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish)->smallend).vect + 2) = uVar7;
          local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      pBVar18 = pBVar18 + 1;
    } while (pBVar18 != pBVar17);
  }
  if (simplify) {
    BoxList::simplify(&local_d8,false);
  }
  BoxArray(&local_98,&local_d8);
  pBVar19 = &local_98;
  pBVar21 = this;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    *(undefined8 *)&pBVar21->m_bat = *(undefined8 *)&pBVar19->m_bat;
    pBVar19 = (BoxArray *)((long)pBVar19 + (ulong)bVar24 * -0x10 + 8);
    pBVar21 = (BoxArray *)((long)pBVar21 + (ulong)bVar24 * -0x10 + 8);
  }
  (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,&local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount);
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_98.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_simplified_list).
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_98.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ~BoxArray(&local_98);
  pvVar9 = (void *)CONCAT44(local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_d8.m_lbox.
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start);
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,(long)local_d8.m_lbox.
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pvVar9);
  }
  if (local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (Box *)0x0) {
    operator_delete(local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
BoxArray::removeOverlap (bool simplify)
{
    if (! ixType().cellCentered()) {
        amrex::Abort("BoxArray::removeOverlap() supports cell-centered only");
    }

    if (crseRatio() != IntVect::TheUnitVector()) {
        amrex::Abort("BoxArray::removeOverlap() must have m_crse_ratio == 1");
    }

    uniqify();

    BARef::HashType& BoxHashMap = m_ref->hash;

    const Box EmptyBox;

    std::vector< std::pair<int,Box> > isects;
    //
    // Note that "size()" can increase in this loop!!!
    //
#ifdef AMREX_MEM_PROFILING
    m_ref->updateMemoryUsage_box(-1);
    m_ref->updateMemoryUsage_hash(-1);
    Long total_hash_bytes_save = m_ref->total_hash_bytes;
#endif

    BoxList bl_diff;

    for (int i = 0; i < size(); i++)
    {
        if (m_ref->m_abox[i].ok())
        {
            intersections(m_ref->m_abox[i],isects);

            for (int j = 0, N = isects.size(); j < N; j++)
            {
                if (isects[j].first == i) continue;

                Box& bx = m_ref->m_abox[isects[j].first];

                amrex::boxDiff(bl_diff, bx, isects[j].second);

                bx = EmptyBox;

                for (const Box& b : bl_diff)
                {
                    m_ref->m_abox.push_back(b);
                    BoxHashMap[amrex::coarsen(b.smallEnd(),m_ref->crsn)].push_back(size()-1);
                }
            }
        }
    }
#ifdef AMREX_MEM_PROFILING
    m_ref->updateMemoryUsage_box(1);
#endif
    //
    // We now have "holes" in our BoxArray. Make us good.
    //
    BoxList bl(ixType());
    for (const auto& b : m_ref->m_abox) {
        if (b.ok()) {
            bl.push_back(b);
        }
    }

    if (simplify) {
        bl.simplify();
    }

    BoxArray nba(std::move(bl));

    *this = nba;

#ifdef AMREX_MEM_PROFILING
    m_ref->total_hash_bytes = total_hash_bytes_save;
#endif

    BL_ASSERT(isDisjoint());
}